

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamtests.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_5278::KtxTexture<ktxTexture>::~KtxTexture(KtxTexture<ktxTexture> *this)

{
  ktxTexture *pkVar1;
  
  pkVar1 = this->_handle;
  if (pkVar1 != (ktxTexture *)0x0) {
    (*pkVar1->vtbl->Destroy)(pkVar1);
    this->_handle = (ktxTexture *)0x0;
  }
  return;
}

Assistant:

~KtxTexture()
    {
        if (_handle)
        {
            ktxTexture_Destroy(handle<ktxTexture>()); _handle = nullptr;
        }
    }